

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

fy_token * fy_node_value_token(fy_node *fyn)

{
  long lStack_8;
  
  if (fyn != (fy_node *)0x0) {
    switch(fyn->field_0x34 & 3) {
    case 0:
      lStack_8 = 0x48;
      break;
    default:
      lStack_8 = 0x58;
      break;
    case 3:
      goto switchD_001241c7_caseD_3;
    }
    return *(fy_token **)((long)&(fyn->node).next + lStack_8);
  }
switchD_001241c7_caseD_3:
  return (fy_token *)0x0;
}

Assistant:

struct fy_token *fy_node_value_token(struct fy_node *fyn) {
    struct fy_token *fyt;

    if (!fyn)
        return NULL;

    switch (fyn->type) {
        case FYNT_SCALAR:
            fyt = fyn->scalar;
            break;
        case FYNT_SEQUENCE:
            fyt = fyn->sequence_start;
            break;
        case FYNT_MAPPING:
            fyt = fyn->mapping_start;
            break;
        default:
            fyt = NULL;
            break;
    }

    return fyt;
}